

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

string * __thiscall
helics::CoreBroker::query_abi_cxx11_
          (string *__return_storage_ptr__,CoreBroker *this,string_view target,string_view queryStr,
          HelicsSequencingModes mode)

{
  BrokerBase *this_00;
  atomic<int> *paVar1;
  uint uVar2;
  string_view request;
  string_view request_00;
  bool bVar3;
  int iVar4;
  string *psVar5;
  char *pcVar6;
  ulong __n;
  action_t aVar7;
  long lVar8;
  undefined1 auVar9 [8];
  size_type __rlen;
  future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  queryResult_1;
  ActionMessage querycmd;
  undefined1 local_128 [8];
  json_value local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  data local_f8;
  undefined1 local_e8 [8];
  undefined8 local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8 [3];
  SmallBuffer local_a8;
  
  local_108._M_str = queryStr._M_str;
  local_108._M_len = queryStr._M_len;
  pcVar6 = target._M_str;
  __n = target._M_len;
  this_00 = &this->super_BrokerBase;
  if ((this->super_BrokerBase).brokerState._M_i < TERMINATING) {
    uVar2 = (this->super_BrokerBase).global_id._M_i.gid;
    if ((__n == 6) && (iVar4 = bcmp(pcVar6,"broker",6), iVar4 == 0)) {
LAB_002f0a17:
      request_00._M_str = local_108._M_str;
      request_00._M_len = local_108._M_len;
      quickBrokerQueries_abi_cxx11_((string *)local_128,this,request_00);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120.object ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (((_Base_ptr)local_108._M_len == (_Base_ptr)0x7) &&
           (iVar4 = bcmp(local_108._M_str,"address",7), iVar4 == 0)) {
          psVar5 = getAddress_abi_cxx11_(this);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::
          basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar5);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::dump((string_t *)local_e8,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_f8,-1,' ',true,hex);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_f8);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8);
          if (local_e8 != (undefined1  [8])local_d8) {
            operator_delete((void *)local_e8,
                            CONCAT44(local_d8[0]._M_allocated_capacity._4_4_,
                                     (undefined4)local_d8[0]._M_allocated_capacity) + 1);
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          if (local_128 == (undefined1  [8])&local_118) {
            (__return_storage_ptr__->field_2)._M_allocated_capacity =
                 CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]);
            *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_118._8_8_;
          }
          else {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_128;
            (__return_storage_ptr__->field_2)._M_allocated_capacity =
                 CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]);
          }
          __return_storage_ptr__->_M_string_length = (size_type)local_120;
          goto LAB_002f0c33;
        }
        aVar7 = cmd_broker_query_ordered;
        if (mode == HELICS_SEQUENCING_MODE_FAST) {
          aVar7 = cmd_broker_query;
        }
        ActionMessage::ActionMessage((ActionMessage *)local_e8,aVar7);
        pcVar6 = local_108._M_str;
        local_a8.bufferSize = local_108._M_len;
        local_e0 = (_Base_ptr)CONCAT44(local_e0._4_4_,uVar2);
        LOCK();
        paVar1 = &this->queryCounter;
        iVar4 = (paVar1->super___atomic_base<int>)._M_i;
        (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
        UNLOCK();
        iVar4 = iVar4 + 1;
        local_e8._4_4_ = iVar4;
        local_d8[0]._0_4_ = uVar2;
        if ((byte *)local_108._M_str == local_a8.heap) {
        }
        else {
          SmallBuffer::reserve(&local_a8,local_108._M_len);
          if ((_Base_ptr)local_a8.bufferSize != (_Base_ptr)0x0) {
            memcpy(local_a8.heap,pcVar6,local_a8.bufferSize);
          }
        }
        gmlc::concurrency::
        DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::getFuture((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_f8,(int)&this->activeQueries);
        BrokerBase::addActionMessage(this_00,(ActionMessage *)local_e8);
        std::
        future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        get((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __return_storage_ptr__,
            (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_f8);
        gmlc::concurrency::
        DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::finishedWithValue(&this->activeQueries,iVar4);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_value.object !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.m_value.object);
        }
        ActionMessage::~ActionMessage((ActionMessage *)local_e8);
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if (local_128 == (undefined1  [8])&local_118) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]);
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_118._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_128;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]);
        }
        __return_storage_ptr__->_M_string_length = (size_type)local_120;
LAB_002f0c33:
        local_128 = (undefined1  [8])&local_118;
        local_120.object = (object_t *)0x0;
        local_118._M_local_buf[0] = '\0';
      }
      if (local_128 == (undefined1  [8])&local_118) {
        return __return_storage_ptr__;
      }
      lVar8 = CONCAT71(local_118._M_allocated_capacity._1_7_,local_118._M_local_buf[0]);
      auVar9 = local_128;
      goto LAB_002f0e37;
    }
    if ((this->super_BrokerBase).identifier._M_string_length != __n) {
      if ((__n >> 1 |
          (ulong)(((undefined1  [16])target & (undefined1  [16])0x1) != (undefined1  [16])0x0) <<
          0x3f) < 6) {
        psVar5 = (string *)(*(code *)(&DAT_003ef758 + *(int *)(&DAT_003ef758 + (__n >> 1) * 4)))();
        return psVar5;
      }
      goto LAB_002f0ca6;
    }
    if ((__n == 0) ||
       (iVar4 = bcmp(pcVar6,(this->super_BrokerBase).identifier._M_dataplus._M_p,__n), iVar4 == 0))
    goto LAB_002f0a17;
    if (__n == 4) {
      iVar4 = bcmp(pcVar6,"root",4);
joined_r0x002f0c80:
      if (iVar4 == 0) {
        aVar7 = cmd_broker_query_ordered;
        if (mode == HELICS_SEQUENCING_MODE_FAST) {
          aVar7 = cmd_broker_query;
        }
        ActionMessage::ActionMessage((ActionMessage *)local_e8,aVar7);
        pcVar6 = local_108._M_str;
        local_a8.bufferSize = local_108._M_len;
        local_e0 = (_Base_ptr)CONCAT44(local_e0._4_4_,uVar2);
        LOCK();
        paVar1 = &this->queryCounter;
        iVar4 = (paVar1->super___atomic_base<int>)._M_i;
        (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
        UNLOCK();
        iVar4 = iVar4 + 1;
        local_e8._4_4_ = iVar4;
        if ((byte *)local_108._M_str == local_a8.heap) {
        }
        else {
          SmallBuffer::reserve(&local_a8,local_108._M_len);
          if ((_Base_ptr)local_a8.bufferSize != (_Base_ptr)0x0) {
            memcpy(local_a8.heap,pcVar6,local_a8.bufferSize);
          }
        }
        gmlc::concurrency::
        DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::getFuture((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_128,(int)&this->activeQueries);
        transmitToParent(this,(ActionMessage *)local_e8);
        std::
        future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        get((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __return_storage_ptr__,
            (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_128);
        gmlc::concurrency::
        DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::finishedWithValue(&this->activeQueries,iVar4);
        goto LAB_002f0e81;
      }
LAB_002f0ca6:
      aVar7 = cmd_query_ordered;
      if (mode == HELICS_SEQUENCING_MODE_FAST) {
        aVar7 = cmd_query;
      }
      ActionMessage::ActionMessage((ActionMessage *)local_e8,aVar7);
      local_e0 = (_Base_ptr)CONCAT44(local_e0._4_4_,uVar2);
      LOCK();
      paVar1 = &this->queryCounter;
      iVar4 = (paVar1->super___atomic_base<int>)._M_i;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      iVar4 = iVar4 + 1;
      local_e8._4_4_ = iVar4;
      SmallBuffer::operator=(&local_a8,&local_108);
      ActionMessage::setStringData((ActionMessage *)local_e8,(string_view)target);
      gmlc::concurrency::
      DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::getFuture((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_128,(int)&this->activeQueries);
      transmitToParent(this,(ActionMessage *)local_e8);
      std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::get((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __return_storage_ptr__,
            (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_128);
      gmlc::concurrency::
      DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::finishedWithValue(&this->activeQueries,iVar4);
LAB_002f0e81:
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120.object !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120.object);
      }
      ActionMessage::~ActionMessage((ActionMessage *)local_e8);
      return __return_storage_ptr__;
    }
    if (__n == 10) {
      iVar4 = bcmp(pcVar6,"rootbroker",10);
      goto joined_r0x002f0c80;
    }
    if (__n != 6) goto LAB_002f0ca6;
    iVar4 = bcmp(pcVar6,"parent",6);
    if (iVar4 != 0) goto LAB_002f0ca6;
    if ((this->super_BrokerBase).field_0x294 != '\x01') {
      aVar7 = cmd_broker_query_ordered;
      if (mode == HELICS_SEQUENCING_MODE_FAST) {
        aVar7 = cmd_broker_query;
      }
      ActionMessage::ActionMessage((ActionMessage *)local_e8,aVar7);
      local_e0 = (_Base_ptr)CONCAT44(local_e0._4_4_,uVar2);
      LOCK();
      paVar1 = &this->queryCounter;
      local_e8._4_4_ = (paVar1->super___atomic_base<int>)._M_i;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      local_e8._4_4_ = local_e8._4_4_ + 1;
      SmallBuffer::operator=(&local_a8,&local_108);
      gmlc::concurrency::
      DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::getFuture((DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_128,(int)&this->activeQueries);
      BrokerBase::addActionMessage(this_00,(ActionMessage *)local_e8);
      std::future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::get((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __return_storage_ptr__,
            (future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_128);
      gmlc::concurrency::
      DelayedObjects<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::finishedWithValue(&this->activeQueries,local_e8._4_4_);
      goto LAB_002f0e81;
    }
    local_e8 = (undefined1  [8])local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"broker has no parent","");
    generateJsonErrorResponse((string *)__return_storage_ptr__,NOT_FOUND,(string *)local_e8);
  }
  else {
    if ((__n == 6) && (iVar4 = bcmp(pcVar6,"broker",6), iVar4 == 0)) {
LAB_002f09a5:
      request._M_str = local_108._M_str;
      request._M_len = local_108._M_len;
      quickBrokerQueries_abi_cxx11_((string *)local_e8,this,request);
      if (local_e0 == (_Base_ptr)0x0) {
        bVar3 = true;
        if (((_Base_ptr)local_108._M_len == (_Base_ptr)0x4) &&
           (iVar4 = bcmp(local_108._M_str,"logs",4), iVar4 == 0)) {
          local_128 = (undefined1  [8])((ulong)local_128 & 0xffffffffffffff00);
          local_120.object = (object_t *)0x0;
          BrokerBase::addBaseInformation
                    (this_00,(json *)local_128,(bool)(~(this->super_BrokerBase).field_0x293 & 1));
          bufferToJson(&((this->super_BrokerBase).mLogManager.
                         super___shared_ptr<helics::LogManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                        ->mLogBuffer,(json *)local_128);
          fileops::generateJsonString((string *)__return_storage_ptr__,(json *)local_128,true);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data((data *)local_128);
          goto LAB_002f0bb4;
        }
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        if (local_e8 == (undefined1  [8])local_d8) {
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT44(local_d8[0]._M_allocated_capacity._4_4_,
                        (undefined4)local_d8[0]._M_allocated_capacity);
          *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_d8[0]._8_8_;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_e8;
          (__return_storage_ptr__->field_2)._M_allocated_capacity =
               CONCAT44(local_d8[0]._M_allocated_capacity._4_4_,
                        (undefined4)local_d8[0]._M_allocated_capacity);
        }
        __return_storage_ptr__->_M_string_length = (size_type)local_e0;
        local_e0 = (_Base_ptr)0x0;
        local_d8[0]._M_allocated_capacity._0_4_ =
             (undefined4)local_d8[0]._M_allocated_capacity & 0xffffff00;
        local_e8 = (undefined1  [8])local_d8;
LAB_002f0bb4:
        bVar3 = false;
      }
      if (local_e8 != (undefined1  [8])local_d8) {
        operator_delete((void *)local_e8,
                        CONCAT44(local_d8[0]._M_allocated_capacity._4_4_,
                                 (undefined4)local_d8[0]._M_allocated_capacity) + 1);
      }
      if (!bVar3) {
        return __return_storage_ptr__;
      }
    }
    else {
      if ((this->super_BrokerBase).identifier._M_string_length == __n) {
        if ((__n != 0) &&
           (iVar4 = bcmp(pcVar6,(this->super_BrokerBase).identifier._M_dataplus._M_p,__n),
           iVar4 != 0)) {
          if (__n == 10) goto LAB_002f097c;
          if (__n == 4) goto LAB_002f0951;
          goto LAB_002f0bda;
        }
        goto LAB_002f09a5;
      }
      if (__n == 0) goto LAB_002f09a5;
      if (__n == 4) {
LAB_002f0951:
        iVar4 = bcmp(pcVar6,"root",__n);
        if ((iVar4 == 0) && (((this->super_BrokerBase).field_0x293 & 1) != 0)) goto LAB_002f09a5;
      }
      if (__n == 10) {
LAB_002f097c:
        iVar4 = bcmp(pcVar6,"federation",__n);
        if ((iVar4 == 0) && (((this->super_BrokerBase).field_0x293 & 1) != 0)) goto LAB_002f09a5;
      }
    }
LAB_002f0bda:
    local_e8 = (undefined1  [8])local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"Broker has terminated","");
    generateJsonErrorResponse((string *)__return_storage_ptr__,DISCONNECTED,(string *)local_e8);
  }
  if (local_e8 == (undefined1  [8])local_d8) {
    return __return_storage_ptr__;
  }
  lVar8 = CONCAT44(local_d8[0]._M_allocated_capacity._4_4_,
                   (undefined4)local_d8[0]._M_allocated_capacity);
  auVar9 = local_e8;
LAB_002f0e37:
  operator_delete((void *)auVar9,lVar8 + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string CoreBroker::query(std::string_view target,
                              std::string_view queryStr,
                              HelicsSequencingModes mode)
{
    if (getBrokerState() >= BrokerState::TERMINATING) {
        if (target == "broker" || target == getIdentifier() || target.empty() ||
            (target == "root" && _isRoot) || (target == "federation" && _isRoot)) {
            auto res = quickBrokerQueries(queryStr);
            if (!res.empty()) {
                return res;
            }
            if (queryStr == "logs") {
                nlohmann::json base;
                addBaseInformation(base, !isRoot());
                bufferToJson(mLogManager->getLogBuffer(), base);
                return fileops::generateJsonString(base);
            }
        }
        return generateJsonErrorResponse(JsonErrorCodes::DISCONNECTED, "Broker has terminated");
    }
    auto gid = global_id.load();
    if (target == "broker" || target == getIdentifier() || target.empty()) {
        auto res = quickBrokerQueries(queryStr);
        if (!res.empty()) {
            return res;
        }
        if (queryStr == "address") {
            res = generateJsonQuotedString(getAddress());
            return res;
        }
        ActionMessage querycmd(mode == HELICS_SEQUENCING_MODE_FAST ? CMD_BROKER_QUERY :
                                                                     CMD_BROKER_QUERY_ORDERED);
        querycmd.source_id = querycmd.dest_id = gid;
        auto index = ++queryCounter;
        querycmd.messageID = index;
        querycmd.payload = queryStr;
        auto queryResult = activeQueries.getFuture(index);
        addActionMessage(std::move(querycmd));
        auto ret = queryResult.get();
        activeQueries.finishedWithValue(index);
        return ret;
    }
    if (target == "parent") {
        if (isRootc) {
            return generateJsonErrorResponse(JsonErrorCodes::NOT_FOUND,
                                             "broker has no parent");  // LCOV_EXCL_LINE
        }
        ActionMessage querycmd(mode == HELICS_SEQUENCING_MODE_FAST ? CMD_BROKER_QUERY :
                                                                     CMD_BROKER_QUERY_ORDERED);
        querycmd.source_id = gid;
        querycmd.messageID = ++queryCounter;
        querycmd.payload = queryStr;
        auto queryResult = activeQueries.getFuture(querycmd.messageID);
        addActionMessage(querycmd);
        auto ret = queryResult.get();
        activeQueries.finishedWithValue(querycmd.messageID);
        return ret;
    }
    if ((target == "root") || (target == "rootbroker")) {
        ActionMessage querycmd(mode == HELICS_SEQUENCING_MODE_FAST ? CMD_BROKER_QUERY :
                                                                     CMD_BROKER_QUERY_ORDERED);
        querycmd.source_id = gid;
        auto index = ++queryCounter;
        querycmd.messageID = index;
        querycmd.payload = queryStr;
        auto queryResult = activeQueries.getFuture(querycmd.messageID);
        transmitToParent(std::move(querycmd));

        auto ret = queryResult.get();
        activeQueries.finishedWithValue(index);
        return ret;
    }

    ActionMessage querycmd(mode == HELICS_SEQUENCING_MODE_FAST ? CMD_QUERY : CMD_QUERY_ORDERED);
    querycmd.source_id = gid;
    auto index = ++queryCounter;
    querycmd.messageID = index;
    querycmd.payload = queryStr;
    querycmd.setStringData(target);
    auto queryResult = activeQueries.getFuture(querycmd.messageID);
    transmitToParent(std::move(querycmd));

    auto ret = queryResult.get();
    activeQueries.finishedWithValue(index);
    return ret;
}